

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcs_char_traits.hpp
# Opt level: O0

size_t boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length(const_char *cstr)

{
  bool bVar1;
  char *in_RDI;
  const_char *ptr;
  const_char null_char;
  char *local_18;
  
  local_18 = in_RDI;
  while( true ) {
    bVar1 = eq(*local_18,'\0');
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_18 = local_18 + 1;
  }
  return (long)local_18 - (long)in_RDI;
}

Assistant:

static std::size_t length( const_char* cstr )
    {
        const_char null_char = CharT();

        const_char* ptr = cstr;
        while( !eq( *ptr, null_char ) )
            ++ptr;

        return ptr - cstr;
    }